

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O1

Instrument *
Timidity::load_instrument
          (Renderer *song,char *name,int percussion,int panning,int note_to_use,int strip_loop,
          int strip_envelope,int strip_tail)

{
  float fVar1;
  sample_t sVar2;
  byte bVar3;
  ushort uVar4;
  WORD WVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  FileReader *pFVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Instrument *this;
  Sample *pSVar10;
  undefined4 extraout_var_02;
  sample_t *psVar11;
  undefined4 extraout_var_03;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  sample_t *psVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  GF1PatchData patch_data;
  GF1LayerData layer_data;
  FString local_1b8;
  uint local_1ac;
  Sample *local_1a8;
  ulong local_1a0;
  long local_198;
  int local_190;
  int local_18c;
  undefined1 local_188 [7];
  byte local_181;
  SDWORD local_180;
  SDWORD local_17c;
  SDWORD local_178;
  ushort local_174;
  int local_172;
  int local_16e;
  int local_16a;
  byte local_164;
  undefined4 local_163;
  undefined2 local_15f;
  byte local_15d [6];
  byte local_157 [4];
  byte local_153;
  byte local_152;
  byte local_151;
  SWORD local_150;
  ushort local_14e;
  ulong local_128;
  undefined1 local_11f [6];
  byte local_119;
  long local_f0;
  uint local_e8;
  char acStack_da [60];
  byte local_9e;
  undefined1 local_6f [22];
  byte local_59;
  
  if (name == (char *)0x0) {
    return (Instrument *)0x0;
  }
  bVar19 = false;
  local_1ac = percussion;
  local_18c = note_to_use;
  pFVar9 = PathExpander::openFileReader((PathExpander *)pathExpander,name,(int *)0x0);
  if (pFVar9 == (FileReader *)0x0) {
    FString::FString(&local_1b8,name);
    FString::operator+=(&local_1b8,".pat");
    pFVar9 = PathExpander::openFileReader((PathExpander *)pathExpander,local_1b8.Chars,(int *)0x0);
    if (pFVar9 == (FileReader *)0x0) {
      FString::ToUpper(&local_1b8);
      pFVar9 = PathExpander::openFileReader((PathExpander *)pathExpander,local_1b8.Chars,(int *)0x0)
      ;
      bVar19 = pFVar9 == (FileReader *)0x0;
    }
    else {
      bVar19 = false;
    }
    FString::~FString(&local_1b8);
  }
  if (bVar19) {
    cmsg(2,0,"Instrument `%s\' can\'t be found.\n",name);
    return (Instrument *)0x0;
  }
  cmsg(0,2,"Loading instrument %s\n",name);
  iVar6 = (*(pFVar9->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar9,&local_f0,0x81);
  if (CONCAT44(extraout_var,iVar6) != 0x81) goto LAB_0034db25;
  if (local_f0 == 0x4843544150314647) {
    if ((local_e8 >> 0x18 | (local_e8 & 0xff0000) >> 8 | (local_e8 & 0xff00) << 8 | local_e8 << 0x18
        ) < 0x31313000) {
      pcVar15 = "%s: Is an old and unsupported patch version.\n";
    }
    else {
      iVar6 = (*(pFVar9->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar9,local_6f,0x3f);
      if (CONCAT44(extraout_var_00,iVar6) == 0x3f) {
        if (local_9e < 2) {
          if (local_59 < 2) {
            iVar6 = (*(pFVar9->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar9,local_11f,0x2f)
            ;
            bVar12 = local_119;
            if (CONCAT44(extraout_var_01,iVar6) == 0x2f) {
              local_190 = strip_loop;
              if (local_119 == 0) {
                this = (Instrument *)0x0;
                cmsg(2,0,"Instrument has 0 samples.\n");
              }
              else {
                this = (Instrument *)operator_new(0x10);
                this->sample = (Sample *)0x0;
                this->samples = (uint)bVar12;
                pSVar10 = (Sample *)safe_malloc((ulong)(uint)bVar12 * 0x68);
                this->sample = pSVar10;
                memset(pSVar10,0,(ulong)local_119 * 0x68);
                if (local_119 != 0) {
                  local_128 = (ulong)((local_1ac & 0x7f) * 1000) / 0x7f;
                  lVar18 = 0x22;
                  local_1a0 = 0;
                  do {
                    iVar6 = (*(pFVar9->super_FileReaderBase)._vptr_FileReaderBase[2])
                                      (pFVar9,local_188,0x60);
                    if (CONCAT44(extraout_var_02,iVar6) != 0x60) {
LAB_0034db89:
                      cmsg(2,0,"Error reading sample %d.\n",local_1a0);
                      Instrument::~Instrument(this);
                      operator_delete(this,0x10);
                      goto LAB_0034db45;
                    }
                    local_1a8 = this->sample;
                    local_1a8[local_1a0].data_length = local_180;
                    local_1a8[local_1a0].loop_start = local_17c;
                    local_1a8[local_1a0].loop_end = local_178;
                    local_1a8[local_1a0].sample_rate = (uint)local_174;
                    local_1a8[local_1a0].low_freq = (float)local_172;
                    local_1a8[local_1a0].high_freq = (float)local_16e + 0.9999;
                    local_1a8[local_1a0].root_freq = (float)local_16a;
                    local_1a8[local_1a0].high_vel = '\x7f';
                    local_1a8[local_1a0].type = '\0';
                    local_1a8[local_1a0].velocity = -1;
                    uVar4 = (ushort)local_128;
                    if (local_1ac == 0xffffffff) {
                      uVar4 = (ushort)(((local_164 & 0xf) * 1000) / 0xf);
                    }
                    pSVar10 = local_1a8 + local_1a0;
                    pSVar10->panning = uVar4 - 500;
                    local_198 = lVar18;
                    Renderer::compute_pan
                              ((double)uVar4 * 0.001,0,&pSVar10->left_offset,&pSVar10->right_offset)
                    ;
                    if (local_157[2] == 0 || local_157[1] == 0) {
                      pSVar10->tremolo_sweep_increment = 0;
                      pSVar10->tremolo_phase_increment = 0;
                      pSVar10->tremolo_depth = '\0';
                      cmsg(0,3," * no tremolo\n");
                    }
                    else {
                      if (local_157[0] == 0) {
                        uVar14 = 0;
                      }
                      else {
                        uVar14 = (ulong)(uint)(int)((float)(song->control_ratio * 0x260000) /
                                                   ((float)local_157[0] * song->rate));
                      }
                      pSVar10->tremolo_sweep_increment = (SDWORD)uVar14;
                      uVar8 = (uint)((float)(int)((uint)local_157[1] * song->control_ratio * 0x20) /
                                    (song->rate * 38.0));
                      pSVar10->tremolo_phase_increment = uVar8;
                      pSVar10->tremolo_depth = local_157[2];
                      cmsg(0,3," * tremolo: sweep %d, phase %d, depth %d\n",uVar14,(ulong)uVar8,
                           (ulong)local_157[2]);
                    }
                    if (local_152 == 0 || local_153 == 0) {
                      pSVar10->vibrato_sweep_increment = 0;
                      pSVar10->vibrato_control_ratio = 0;
                      pSVar10->vibrato_depth = '\0';
                      cmsg(0,3," * no vibrato\n");
                    }
                    else {
                      fVar1 = song->rate;
                      uVar8 = (uint)((fVar1 * 38.0) / (float)((uint)local_153 << 6));
                      pSVar10->vibrato_control_ratio = uVar8;
                      if (local_157[3] == 0) {
                        uVar14 = 0;
                      }
                      else {
                        uVar14 = (ulong)(uint)(int)(((float)(int)uVar8 * 2490368.0) /
                                                   (fVar1 * (float)local_157[3]));
                      }
                      pSVar10->vibrato_sweep_increment = (SDWORD)uVar14;
                      pSVar10->vibrato_depth = local_152;
                      cmsg(0,3," * vibrato: sweep %d, ctl %d, depth %d\n",uVar14,(ulong)uVar8,
                           (ulong)local_152);
                    }
                    pSVar10->modes = (ushort)local_151;
                    if (panning == -1) {
                      pSVar10->scale_note = local_150;
                      pSVar10->scale_factor = local_14e;
                      if (local_14e < 3) {
                        WVar5 = local_14e << 10;
LAB_0034d840:
                        pSVar10->scale_factor = WVar5;
                      }
                      else {
                        WVar5 = 0x400;
                        if (0x800 < local_14e) goto LAB_0034d840;
                      }
                      if (pSVar10->scale_factor != 0x400) {
                        cmsg(0,3," * Scale: note %d, factor %d\n");
                      }
                    }
                    else {
                      pSVar10->scale_note = (SWORD)panning;
                      pSVar10->scale_factor = 0;
                    }
                    lVar18 = 0;
                    do {
                      if (acStack_da[lVar18] != '\0') goto LAB_0034d897;
                      lVar18 = lVar18 + 1;
                    } while (lVar18 != 0x3c);
                    lVar18 = 0x3c;
LAB_0034d897:
                    if (((local_18c == 1) && ((pSVar10->modes & 0x3c) != 0)) &&
                       (cmsg(0,3," - Removing loop and/or sustain\n"), (int)lVar18 == 0x3c)) {
                      *(byte *)&pSVar10->modes = (byte)pSVar10->modes & 0xc3;
                    }
                    if ((local_190 == 1) &&
                       (cmsg(0,3," - Removing envelope\n"), (int)lVar18 == 0x3c)) {
                      lVar18 = 0;
                      bVar12 = local_15d[0];
                      do {
                        bVar3 = local_15d[lVar18 + 1];
                        if (bVar12 < bVar3) {
                          local_15d[0] = bVar3;
                          bVar12 = bVar3;
                        }
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 5);
                      local_15f = 0x3f3f;
                      local_163 = 0x3f3f3f3f;
                      lVar18 = 0;
                      do {
                        local_15d[lVar18] = local_15d[0];
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 6);
                    }
                    lVar18 = -6;
                    do {
                      *(byte *)((long)&local_1a8->loop_start + lVar18 + local_198) =
                           local_15d[lVar18];
                      bVar12 = local_157[lVar18];
                      if (0xfa < bVar12) {
                        bVar12 = 0xfb;
                      }
                      if (bVar12 < 6) {
                        bVar12 = 5;
                      }
                      *(byte *)((long)&local_1a8->loop_end + lVar18 + local_198 + 2) = bVar12;
                      lVar18 = lVar18 + 1;
                    } while (lVar18 != 0);
                    if ((pSVar10->modes & 1) != 0) {
                      if (pSVar10->data_length < 0x200002) {
                        if ((pSVar10->modes & 1) == 0) goto LAB_0034d991;
                        goto LAB_0034d99e;
                      }
                      goto LAB_0034db89;
                    }
LAB_0034d991:
                    if (0x100000 < pSVar10->data_length) goto LAB_0034db89;
LAB_0034d99e:
                    psVar11 = (sample_t *)safe_malloc((long)pSVar10->data_length);
                    pSVar10->data = psVar11;
                    iVar6 = pSVar10->data_length;
                    iVar7 = (*(pFVar9->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar9);
                    lVar18 = local_198;
                    if (CONCAT44(extraout_var_03,iVar7) != (long)iVar6) goto LAB_0034db89;
                    convert_sample_data(pSVar10,pSVar10->data);
                    if ((pSVar10->modes & 0x10) != 0) {
                      cmsg(1,0,"Reverse loop in %s\n",name);
                      psVar11 = pSVar10->data;
                      iVar6 = pSVar10->data_length;
                      if (2 < iVar6 + 1U) {
                        psVar16 = psVar11 + iVar6;
                        lVar17 = 0;
                        do {
                          sVar2 = psVar11[lVar17];
                          psVar11[lVar17] = *psVar16;
                          *psVar16 = sVar2;
                          psVar16 = psVar16 + -1;
                          lVar17 = lVar17 + 1;
                        } while (iVar6 / 2 != (int)lVar17);
                      }
                      psVar11[iVar6] = psVar11[(long)iVar6 + -1];
                      iVar7 = pSVar10->loop_start;
                      pSVar10->loop_start = iVar6 - pSVar10->loop_end;
                      pSVar10->loop_end = iVar6 - iVar7;
                      pSVar10->modes = pSVar10->modes & 0xffeb | 4;
                    }
                    pSVar10->data_length = pSVar10->data_length << 0xc;
                    uVar8 = pSVar10->loop_start << 0xc;
                    pSVar10->loop_start = uVar8;
                    uVar13 = pSVar10->loop_end << 0xc;
                    pSVar10->loop_end = uVar13;
                    pSVar10->loop_start = (local_181 & 0xf) << 8 | uVar8;
                    pSVar10->loop_end = (local_181 & 0xfffffff0) << 4 | uVar13;
                    if ((pSVar10->scale_factor == 0) && ((pSVar10->modes & 4) == 0)) {
                      pre_resample(song,pSVar10);
                    }
                    if (strip_envelope == 1) {
                      cmsg(0,3," - Stripping tail\n");
                      pSVar10->data_length = pSVar10->loop_end;
                      lVar18 = local_198;
                    }
                    local_1a0 = local_1a0 + 1;
                    lVar18 = lVar18 + 0x68;
                  } while (local_1a0 < local_119);
                }
              }
              (*(pFVar9->super_FileReaderBase)._vptr_FileReaderBase[1])(pFVar9);
              return this;
            }
            goto LAB_0034db25;
          }
          pcVar15 = "Can\'t handle instruments with %d layers.\n";
        }
        else {
          pcVar15 = "Can\'t handle patches with %d instruments.\n";
        }
        cmsg(2,0,pcVar15);
        goto LAB_0034db40;
      }
LAB_0034db25:
      pcVar15 = "%s: Error reading instrument.\n";
    }
  }
  else {
    pcVar15 = "%s: Not an instrument.\n";
  }
  cmsg(2,0,pcVar15,name);
LAB_0034db40:
  if (pFVar9 == (FileReader *)0x0) {
    return (Instrument *)0x0;
  }
LAB_0034db45:
  (*(pFVar9->super_FileReaderBase)._vptr_FileReaderBase[1])(pFVar9);
  return (Instrument *)0x0;
}

Assistant:

static Instrument *load_instrument(Renderer *song, const char *name, int percussion,
					int panning, int note_to_use,
					int strip_loop, int strip_envelope,
					int strip_tail)
{
	Instrument *ip;
	Sample *sp;
	FileReader *fp;
	GF1PatchHeader header;
	GF1InstrumentData idata;
	GF1LayerData layer_data;
	GF1PatchData patch_data;
	int i, j;
	bool noluck = false;

	if (!name) return 0;

	/* Open patch file */
	if ((fp = pathExpander.openFileReader(name, NULL)) == NULL)
	{
		/* Try with various extensions */
		FString tmp = name;
		tmp += ".pat";
		if ((fp = pathExpander.openFileReader(tmp, NULL)) == NULL)
		{
#ifdef __unix__			// Windows isn't case-sensitive.
			tmp.ToUpper();
			if ((fp = pathExpander.openFileReader(tmp, NULL)) == NULL)
#endif
			{
				noluck = true;
			}
		}
	}

	if (noluck)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Instrument `%s' can't be found.\n", name);
		return 0;
	}

	cmsg(CMSG_INFO, VERB_NOISY, "Loading instrument %s\n", name);

	/* Read some headers and do cursory sanity checks. */

	if (sizeof(header) != fp->Read(&header, sizeof(header)))
	{
failread:
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Error reading instrument.\n", name);
		delete fp;
		return 0;
	}
	if (strncmp(header.Header, GF1_HEADER_TEXT, HEADER_SIZE - 4) != 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Not an instrument.\n", name);
		delete fp;
		return 0;
	}
	if (strcmp(header.Header + 8, "110") < 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Is an old and unsupported patch version.\n", name);
		delete fp;
		return 0;
	}
	if (sizeof(idata) != fp->Read(&idata, sizeof(idata)))
	{
		goto failread;
	}

	header.WaveForms = LittleShort(header.WaveForms);
	header.MasterVolume = LittleShort(header.MasterVolume);
	header.DataSize = LittleLong(header.DataSize);
	idata.Instrument = LittleShort(idata.Instrument);

	if (header.Instruments != 1 && header.Instruments != 0) /* instruments. To some patch makers, 0 means 1 */
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Can't handle patches with %d instruments.\n", header.Instruments);
		delete fp;
		return 0;
	}

	if (idata.Layers != 1 && idata.Layers != 0) /* layers. What's a layer? */
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Can't handle instruments with %d layers.\n", idata.Layers);
		delete fp;
		return 0;
	}

	if (sizeof(layer_data) != fp->Read(&layer_data, sizeof(layer_data)))
	{
		goto failread;
	}

	if (layer_data.Samples == 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Instrument has 0 samples.\n");
		delete fp;
		return 0;
	}

	ip = new Instrument;
	ip->samples = layer_data.Samples;
	ip->sample = (Sample *)safe_malloc(sizeof(Sample) * layer_data.Samples);
	memset(ip->sample, 0, sizeof(Sample) * layer_data.Samples);
	for (i = 0; i < layer_data.Samples; ++i)
	{
		if (sizeof(patch_data) != fp->Read(&patch_data, sizeof(patch_data)))
		{
fail:
			cmsg(CMSG_ERROR, VERB_NORMAL, "Error reading sample %d.\n", i);
			delete ip;
			delete fp;
			return 0;
		}

		sp = &(ip->sample[i]);

		sp->data_length = LittleLong(patch_data.WaveSize);
		sp->loop_start = LittleLong(patch_data.StartLoop);
		sp->loop_end = LittleLong(patch_data.EndLoop);
		sp->sample_rate = LittleShort(patch_data.SampleRate);
		sp->low_freq = float(LittleLong(patch_data.LowFrequency));
		sp->high_freq = float(LittleLong(patch_data.HighFrequency)) + 0.9999f;
		sp->root_freq = float(LittleLong(patch_data.RootFrequency));
		sp->high_vel = 127;
		sp->velocity = -1;
		sp->type = INST_GUS;

		// Expand to SF2 range.
		if (panning == -1)
		{
			sp->panning = (patch_data.Balance & 0x0F) * 1000 / 15 - 500;
		}
		else
		{
			sp->panning = (panning & 0x7f) * 1000 / 127 - 500;
		}
		song->compute_pan((sp->panning + 500) / 1000.0, INST_GUS, sp->left_offset, sp->right_offset);

		/* tremolo */
		if (patch_data.TremoloRate == 0 || patch_data.TremoloDepth == 0)
		{
			sp->tremolo_sweep_increment = 0;
			sp->tremolo_phase_increment = 0;
			sp->tremolo_depth = 0;
			cmsg(CMSG_INFO, VERB_DEBUG, " * no tremolo\n");
		}
		else
		{
			sp->tremolo_sweep_increment = convert_tremolo_sweep(song, patch_data.TremoloSweep);
			sp->tremolo_phase_increment = convert_tremolo_rate(song, patch_data.TremoloRate);
			sp->tremolo_depth = patch_data.TremoloDepth;
			cmsg(CMSG_INFO, VERB_DEBUG, " * tremolo: sweep %d, phase %d, depth %d\n",
				sp->tremolo_sweep_increment, sp->tremolo_phase_increment, sp->tremolo_depth);
		}

		/* vibrato */
		if (patch_data.VibratoRate == 0 || patch_data.VibratoDepth == 0)
		{
			sp->vibrato_sweep_increment = 0;
			sp->vibrato_control_ratio = 0;
			sp->vibrato_depth = 0;
			cmsg(CMSG_INFO, VERB_DEBUG, " * no vibrato\n");
		}
		else
		{
			sp->vibrato_control_ratio = convert_vibrato_rate(song, patch_data.VibratoRate);
			sp->vibrato_sweep_increment = convert_vibrato_sweep(song, patch_data.VibratoSweep, sp->vibrato_control_ratio);
			sp->vibrato_depth = patch_data.VibratoDepth;
			cmsg(CMSG_INFO, VERB_DEBUG, " * vibrato: sweep %d, ctl %d, depth %d\n",
				sp->vibrato_sweep_increment, sp->vibrato_control_ratio, sp->vibrato_depth);
		}

		sp->modes = patch_data.Modes;

		/* Mark this as a fixed-pitch instrument if such a deed is desired. */
		if (note_to_use != -1)
		{
			sp->scale_note = note_to_use;
			sp->scale_factor = 0;
		}
		else
		{
			sp->scale_note = LittleShort(patch_data.ScaleFrequency);
			sp->scale_factor = LittleShort(patch_data.ScaleFactor);
			if (sp->scale_factor <= 2)
			{
				sp->scale_factor *= 1024;
			}
			else if (sp->scale_factor > 2048)
			{
				sp->scale_factor = 1024;
			}
			if (sp->scale_factor != 1024)
			{
				cmsg(CMSG_INFO, VERB_DEBUG, " * Scale: note %d, factor %d\n",
					sp->scale_note, sp->scale_factor);
			}
		}

#if 0
		/* seashore.pat in the Midia patch set has no Sustain. I don't
		   understand why, and fixing it by adding the Sustain flag to
		   all looped patches probably breaks something else. We do it
		   anyway. */

		if (sp->modes & PATCH_LOOPEN) 
		{
			sp->modes |= PATCH_SUSTAIN;
		}
#endif
		/* [RH] Alas, eawpats has percussion instruments with bad envelopes. :(
		 * (See cymchina.pat for one example of this sadness.)
		 * Do this logic for instruments without a description, only. Hopefully that
		 * catches all the patches that need it without including any extra.
		 */
		for (j = 0; j < DESC_SIZE; ++j)
		{
			if (header.Description[j] != 0)
				break;
		}
		/* Strip any loops and envelopes we're permitted to */
		/* [RH] (But PATCH_BACKWARD isn't a loop flag at all!) */
		if ((strip_loop == 1) && 
			(sp->modes & (PATCH_SUSTAIN | PATCH_LOOPEN | PATCH_BIDIR | PATCH_BACKWARD)))
		{
			cmsg(CMSG_INFO, VERB_DEBUG, " - Removing loop and/or sustain\n");
			if (j == DESC_SIZE)
			{
				sp->modes &= ~(PATCH_SUSTAIN | PATCH_LOOPEN | PATCH_BIDIR | PATCH_BACKWARD);
			}
		}

		if (strip_envelope == 1)
		{
			cmsg(CMSG_INFO, VERB_DEBUG, " - Removing envelope\n");
			/* [RH] The envelope isn't really removed, but this is the way the standard
			 * Gravis patches get that effect: All rates at maximum, and all offsets at
			 * a constant level.
			 */
			if (j == DESC_SIZE)
			{
				int k;
				for (k = 1; k < ENVELOPES; ++k)
				{ /* Find highest offset. */
					if (patch_data.EnvelopeOffset[k] > patch_data.EnvelopeOffset[0])
					{
						patch_data.EnvelopeOffset[0] = patch_data.EnvelopeOffset[k];
					}
				}
				for (k = 0; k < ENVELOPES; ++k)
				{
					patch_data.EnvelopeRate[k] = 63;
					patch_data.EnvelopeOffset[k] = patch_data.EnvelopeOffset[0];
				}
			}
		}

		for (j = 0; j < 6; j++)
		{
			sp->envelope.gf1.rate[j] = patch_data.EnvelopeRate[j];
			/* [RH] GF1NEW clamps the offsets to the range [5,251], so we do too. */
			sp->envelope.gf1.offset[j] = clamp<BYTE>(patch_data.EnvelopeOffset[j], 5, 251);
		}

		/* Then read the sample data */
		if (((sp->modes & PATCH_16) && sp->data_length/2 > MAX_SAMPLE_SIZE) ||
			(!(sp->modes & PATCH_16) && sp->data_length > MAX_SAMPLE_SIZE))
		{
			goto fail;
		}
		sp->data = (sample_t *)safe_malloc(sp->data_length);

		if (sp->data_length != fp->Read(sp->data, sp->data_length))
			goto fail;

		convert_sample_data(sp, sp->data);

		/* Reverse reverse loops and pass them off as normal loops */
		if (sp->modes & PATCH_BACKWARD)
		{
			int t;
			/* The GUS apparently plays reverse loops by reversing the
			   whole sample. We do the same because the GUS does not SUCK. */

			cmsg(CMSG_WARNING, VERB_NORMAL, "Reverse loop in %s\n", name);
			reverse_data((sample_t *)sp->data, 0, sp->data_length);
			sp->data[sp->data_length] = sp->data[sp->data_length - 1];

			t = sp->loop_start;
			sp->loop_start = sp->data_length - sp->loop_end;
			sp->loop_end = sp->data_length - t;

			sp->modes &= ~PATCH_BACKWARD;
			sp->modes |= PATCH_LOOPEN; /* just in case */
		}

		/* Then fractional samples */
		sp->data_length <<= FRACTION_BITS;
		sp->loop_start <<= FRACTION_BITS;
		sp->loop_end <<= FRACTION_BITS;

		/* Adjust for fractional loop points. */
		sp->loop_start |= (patch_data.Fractions & 0x0F) << (FRACTION_BITS-4);
		sp->loop_end   |= (patch_data.Fractions & 0xF0) << (FRACTION_BITS-4-4);

		/* If this instrument will always be played on the same note,
		   and it's not looped, we can resample it now. */
		if (sp->scale_factor == 0 && !(sp->modes & PATCH_LOOPEN))
		{
			pre_resample(song, sp);
		}

		if (strip_tail == 1)
		{
			/* Let's not really, just say we did. */
			cmsg(CMSG_INFO, VERB_DEBUG, " - Stripping tail\n");
			sp->data_length = sp->loop_end;
		}
	}
	delete fp;
	return ip;
}